

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

Alignment * __thiscall
spoa::SisdAlignmentEngine::Align
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,char *sequence,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  invalid_argument *piVar4;
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  *pvVar5;
  size_type sVar6;
  int64_t iVar7;
  bad_alloc *ba;
  int32_t *score_local;
  Graph *graph_local;
  uint32_t sequence_len_local;
  char *sequence_local;
  SisdAlignmentEngine *this_local;
  
  uVar2 = std::numeric_limits<int>::max();
  if (uVar2 < sequence_len) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"[spoa::SisdAlignmentEngine::Align] error: too large sequence!");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar5 = Graph::nodes(graph);
  bVar1 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::empty(pvVar5);
  if ((bVar1) || (sequence_len == 0)) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__);
  }
  else {
    pvVar5 = Graph::nodes(graph);
    sVar6 = std::
            vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
            ::size(pvVar5);
    iVar7 = AlignmentEngine::WorstCaseAlignmentScore
                      (&this->super_AlignmentEngine,(ulong)sequence_len,sVar6);
    if (iVar7 < -0x7ffffc00) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,"[spoa::SisdAlignmentEngine::Align] error: possible overflow!");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pvVar5 = Graph::nodes(graph);
    sVar6 = std::
            vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
            ::size(pvVar5);
    uVar3 = Graph::num_codes(graph);
    Realloc(this,(ulong)(sequence_len + 1),sVar6 + 1,(uint8_t)uVar3);
    Initialize(this,sequence,sequence_len,graph);
    if ((this->super_AlignmentEngine).subtype_ == kLinear) {
      Linear(__return_storage_ptr__,this,sequence_len,graph,score);
    }
    else if ((this->super_AlignmentEngine).subtype_ == kAffine) {
      Affine(__return_storage_ptr__,this,sequence_len,graph,score);
    }
    else if ((this->super_AlignmentEngine).subtype_ == kConvex) {
      Convex(__return_storage_ptr__,this,sequence_len,graph,score);
    }
    else {
      memset(__return_storage_ptr__,0,0x18);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Alignment SisdAlignmentEngine::Align(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) {
  if (sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Align] error: too large sequence!");
  }

  if (graph.nodes().empty() || sequence_len == 0) {
    return Alignment();
  }

  if (WorstCaseAlignmentScore(sequence_len, graph.nodes().size()) < kNegativeInfinity) {  // NOLINT
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Align] error: possible overflow!");
  }

  try {
    Realloc(sequence_len + 1, graph.nodes().size() + 1, graph.num_codes());
  } catch (std::bad_alloc& ba) {
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Align] error: insufficient memory!");
  }
  Initialize(sequence, sequence_len, graph);

  if (subtype_ == AlignmentSubtype::kLinear) {
    return Linear(sequence_len, graph, score);
  } else if (subtype_ == AlignmentSubtype::kAffine) {
    return Affine(sequence_len, graph, score);
  } else if (subtype_ == AlignmentSubtype::kConvex) {
    return Convex(sequence_len, graph, score);
  }
  return Alignment();
}